

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::isAcceptable(void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  if ((((0x13 < pInfo->size) && (pInfo->isBigEndian == '\0')) && (pInfo->charsetFamily == '\0')) &&
     (((pInfo->dataFormat[0] == 'u' && (pInfo->dataFormat[1] == 'n')) &&
      ((pInfo->dataFormat[2] == 'a' && (pInfo->dataFormat[3] == 'm')))))) {
    return pInfo->formatVersion[0] == '\x01';
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
isAcceptable(void * /*context*/,
             const char * /*type*/, const char * /*name*/,
             const UDataInfo *pInfo) {
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1);
}